

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O3

void ExtendLastCommand(BrotliEncoderStateInternal *s,uint32_t *bytes,
                      uint32_t *wrapped_last_processed_pos)

{
  ushort uVar1;
  Command *pCVar2;
  size_t sVar3;
  uint8_t *puVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  size_t sVar16;
  size_t sVar17;
  ulong uVar18;
  uint8_t *puVar19;
  uint uVar20;
  uint32_t uVar21;
  ulong uVar22;
  
  pCVar2 = s->commands_;
  sVar3 = s->num_commands_;
  uVar15 = (1L << ((byte)(s->params).lgwin & 0x3f)) - 0x10;
  uVar13 = (ulong)(pCVar2[sVar3 - 1].copy_len_ & 0x1ffffff);
  uVar18 = s->last_processed_pos_ - uVar13;
  if (uVar15 <= uVar18) {
    uVar18 = uVar15;
  }
  iVar11 = s->dist_cache_[0];
  uVar15 = (ulong)iVar11;
  uVar1 = pCVar2[sVar3 - 1].dist_prefix_;
  uVar20 = uVar1 & 0x3ff;
  uVar21 = (s->params).dist.num_direct_distance_codes;
  uVar8 = uVar21 + 0x10;
  if (uVar8 <= uVar20) {
    uVar7 = (s->params).dist.distance_postfix_bits;
    bVar10 = (byte)uVar7;
    uVar20 = (uVar20 - uVar21) - 0x10;
    uVar20 = uVar8 + (~(-1 << (bVar10 & 0x1f)) & uVar20) +
             ((((uVar20 >> (uVar7 & 0x1f) & 1) != 0) + 2 << ((byte)(uVar1 >> 10) & 0x1f)) +
              pCVar2[sVar3 - 1].dist_extra_ + -4 << (bVar10 & 0x1f));
  }
  if (uVar20 - 0xf == uVar15 || uVar20 < 0x10) {
    uVar8 = (s->ringbuffer_).mask_;
    puVar4 = (s->ringbuffer_).buffer_;
    uVar22 = uVar15 - uVar18;
    if (uVar15 < uVar18 || uVar22 == 0) {
      if (*bytes != 0) {
        uVar21 = *wrapped_last_processed_pos;
        do {
          if (puVar4[uVar21 & uVar8] != puVar4[uVar21 - iVar11 & uVar8]) break;
          pCVar2[sVar3 - 1].copy_len_ = pCVar2[sVar3 - 1].copy_len_ + 1;
          *bytes = *bytes - 1;
          uVar21 = *wrapped_last_processed_pos + 1;
          *wrapped_last_processed_pos = uVar21;
        } while (*bytes != 0);
      }
    }
    else {
      uVar18 = (s->params).dictionary.compound.total_size;
      if ((uVar22 - 1 < uVar18) && (uVar13 < uVar22)) {
        uVar13 = (uVar18 - uVar22) + uVar13;
        sVar16 = 0xffffffffffffffff;
        do {
          sVar17 = sVar16;
          uVar18 = (s->params).dictionary.compound.chunk_offsets[sVar17 + 2];
          sVar16 = sVar17 + 1;
        } while (uVar18 <= uVar13);
        if (*bytes != 0) {
          puVar19 = (s->params).dictionary.compound.chunk_source[sVar17 + 1];
          sVar16 = (s->params).dictionary.compound.chunk_offsets[sVar17 + 1];
          lVar12 = uVar18 - sVar16;
          lVar14 = uVar13 - sVar16;
          uVar21 = *wrapped_last_processed_pos;
          sVar16 = sVar17 + 1;
          do {
            if (puVar4[uVar21 & uVar8] != puVar19[lVar14]) break;
            pCVar2[sVar3 - 1].copy_len_ = pCVar2[sVar3 - 1].copy_len_ + 1;
            *bytes = *bytes - 1;
            uVar21 = *wrapped_last_processed_pos + 1;
            *wrapped_last_processed_pos = uVar21;
            lVar14 = lVar14 + 1;
            sVar17 = sVar16;
            if (lVar14 == lVar12) {
              sVar17 = sVar16 + 1;
              if (sVar17 == (s->params).dictionary.compound.num_chunks) break;
              puVar19 = (s->params).dictionary.compound.chunk_source[sVar16 + 1];
              lVar12 = (s->params).dictionary.compound.chunk_offsets[sVar16 + 2] -
                       (s->params).dictionary.compound.chunk_offsets[sVar16 + 1];
              lVar14 = 0;
            }
            sVar16 = sVar17;
          } while (*bytes != 0);
        }
      }
    }
    uVar8 = pCVar2[sVar3 - 1].insert_len_;
    uVar7 = (pCVar2[sVar3 - 1].copy_len_ >> 0x19) + (pCVar2[sVar3 - 1].copy_len_ & 0x1ffffff);
    uVar20 = uVar8;
    if (5 < (ulong)uVar8) {
      if (uVar8 < 0x82) {
        uVar18 = (ulong)uVar8 - 2;
        uVar8 = 0x1f;
        uVar20 = (uint)uVar18;
        if (uVar20 != 0) {
          for (; uVar20 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar20 = (int)(uVar18 >> ((char)(uVar8 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar8 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (uVar8 < 0x842) {
        uVar20 = 0x1f;
        if (uVar8 - 0x42 != 0) {
          for (; uVar8 - 0x42 >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        uVar20 = (uVar20 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar20 = 0x15;
        if (0x1841 < uVar8) {
          uVar20 = (uint)(ushort)(0x17 - (uVar8 < 0x5842));
        }
      }
    }
    if (uVar7 < 10) {
      uVar8 = uVar7 - 2;
    }
    else if (uVar7 < 0x86) {
      uVar8 = 0x1f;
      uVar9 = (uint)((ulong)uVar7 - 6);
      if (uVar9 != 0) {
        for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = (int)((ulong)uVar7 - 6 >> ((char)(uVar8 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
              (uVar8 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar8 = 0x17;
      if (uVar7 < 0x846) {
        uVar8 = 0x1f;
        if (uVar7 - 0x46 != 0) {
          for (; uVar7 - 0x46 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar8 = (uVar8 ^ 0xffe0) + 0x2c;
      }
    }
    uVar5 = (ushort)uVar8;
    uVar6 = (uVar5 & 7) + ((ushort)uVar20 & 7) * 8;
    if ((((uVar1 & 0x3ff) == 0) && ((ushort)uVar20 < 8)) && (uVar5 < 0x10)) {
      if (7 < uVar5) {
        uVar6 = uVar6 | 0x40;
      }
    }
    else {
      iVar11 = ((uVar20 & 0xffff) >> 3) * 3 + ((uVar8 & 0xffff) >> 3);
      uVar6 = uVar6 + ((ushort)(0x520d40 >> ((char)iVar11 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar11 * 0x40 + 0x40;
    }
    pCVar2[sVar3 - 1].cmd_prefix_ = uVar6;
  }
  return;
}

Assistant:

static void ExtendLastCommand(BrotliEncoderState* s, uint32_t* bytes,
                              uint32_t* wrapped_last_processed_pos) {
  Command* last_command = &s->commands_[s->num_commands_ - 1];
  const uint8_t* data = s->ringbuffer_.buffer_;
  const uint32_t mask = s->ringbuffer_.mask_;
  uint64_t max_backward_distance =
      (((uint64_t)1) << s->params.lgwin) - BROTLI_WINDOW_GAP;
  uint64_t last_copy_len = last_command->copy_len_ & 0x1FFFFFF;
  uint64_t last_processed_pos = s->last_processed_pos_ - last_copy_len;
  uint64_t max_distance = last_processed_pos < max_backward_distance ?
      last_processed_pos : max_backward_distance;
  uint64_t cmd_dist = (uint64_t)s->dist_cache_[0];
  uint32_t distance_code = CommandRestoreDistanceCode(last_command,
                                                      &s->params.dist);
  const CompoundDictionary* dict = &s->params.dictionary.compound;
  size_t compound_dictionary_size = dict->total_size;
  if (distance_code < BROTLI_NUM_DISTANCE_SHORT_CODES ||
      distance_code - (BROTLI_NUM_DISTANCE_SHORT_CODES - 1) == cmd_dist) {
    if (cmd_dist <= max_distance) {
      while (*bytes != 0 && data[*wrapped_last_processed_pos & mask] ==
             data[(*wrapped_last_processed_pos - cmd_dist) & mask]) {
        last_command->copy_len_++;
        (*bytes)--;
        (*wrapped_last_processed_pos)++;
      }
    } else {
      if ((cmd_dist - max_distance - 1) < compound_dictionary_size &&
          last_copy_len < cmd_dist - max_distance) {
        size_t address =
            compound_dictionary_size - (size_t)(cmd_dist - max_distance) +
            (size_t)last_copy_len;
        size_t br_index = 0;
        size_t br_offset;
        const uint8_t* chunk;
        size_t chunk_length;
        while (address >= dict->chunk_offsets[br_index + 1]) br_index++;
        br_offset = address - dict->chunk_offsets[br_index];
        chunk = dict->chunk_source[br_index];
        chunk_length =
            dict->chunk_offsets[br_index + 1] - dict->chunk_offsets[br_index];
        while (*bytes != 0 && data[*wrapped_last_processed_pos & mask] ==
               chunk[br_offset]) {
          last_command->copy_len_++;
          (*bytes)--;
          (*wrapped_last_processed_pos)++;
          if (++br_offset == chunk_length) {
            br_index++;
            br_offset = 0;
            if (br_index != dict->num_chunks) {
              chunk = dict->chunk_source[br_index];
              chunk_length = dict->chunk_offsets[br_index + 1] -
                  dict->chunk_offsets[br_index];
            } else {
              break;
            }
          }
        }
      }
    }
    /* The copy length is at most the metablock size, and thus expressible. */
    GetLengthCode(last_command->insert_len_,
                  (size_t)((int)(last_command->copy_len_ & 0x1FFFFFF) +
                           (int)(last_command->copy_len_ >> 25)),
                  TO_BROTLI_BOOL((last_command->dist_prefix_ & 0x3FF) == 0),
                  &last_command->cmd_prefix_);
  }
}